

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjExporter.cpp
# Opt level: O1

void __thiscall
Assimp::ObjExporter::ObjExporter(ObjExporter *this,char *_filename,aiScene *pScene,bool noMtl)

{
  _Rb_tree_header *p_Var1;
  allocator<char> aaStack_48 [8];
  locale local_40 [8];
  locale local_38 [8];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&this->mOutputMat);
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->filename,_filename,aaStack_48)
  ;
  this->pScene = pScene;
  (this->vn).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vn).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->vn).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->vt).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vt).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->vt).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->vc).super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vc).super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->vc).super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->vp).
  super__Vector_base<Assimp::ObjExporter::vertexData,_std::allocator<Assimp::ObjExporter::vertexData>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vp).
  super__Vector_base<Assimp::ObjExporter::vertexData,_std::allocator<Assimp::ObjExporter::vertexData>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->vp).
  super__Vector_base<Assimp::ObjExporter::vertexData,_std::allocator<Assimp::ObjExporter::vertexData>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->useVc = false;
  (this->mVnMap).mNextIndex = 1;
  p_Var1 = &(this->mVnMap).vecMap._M_t._M_impl.super__Rb_tree_header;
  (this->mVnMap).vecMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mVnMap).vecMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mVnMap).vecMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mVnMap).vecMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->mVnMap).vecMap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->mVtMap).mNextIndex = 1;
  p_Var1 = &(this->mVtMap).vecMap._M_t._M_impl.super__Rb_tree_header;
  (this->mVtMap).vecMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mVtMap).vecMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mVtMap).vecMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mVtMap).vecMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->mVtMap).vecMap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->mVpMap).mNextIndex = 1;
  p_Var1 = &(this->mVpMap).vecMap._M_t._M_impl.super__Rb_tree_header;
  (this->mVpMap).vecMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mVpMap).vecMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mVpMap).vecMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mVpMap).vecMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->mMeshes).
  super__Vector_base<Assimp::ObjExporter::MeshInstance,_std::allocator<Assimp::ObjExporter::MeshInstance>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mMeshes).
  super__Vector_base<Assimp::ObjExporter::MeshInstance,_std::allocator<Assimp::ObjExporter::MeshInstance>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mVpMap).vecMap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->mMeshes).
  super__Vector_base<Assimp::ObjExporter::MeshInstance,_std::allocator<Assimp::ObjExporter::MeshInstance>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->endl)._M_dataplus._M_p = (pointer)&(this->endl).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->endl,"\n","");
  std::locale::locale((locale *)aaStack_48,"C");
  std::ios::imbue(local_38);
  std::locale::~locale(local_38);
  *(undefined8 *)(&this->field_0x8 + *(long *)(*(long *)this + -0x18)) = 8;
  std::ios::imbue(local_40);
  std::locale::~locale(local_40);
  *(undefined8 *)(&this->field_0x180 + *(long *)(*(long *)&this->mOutputMat + -0x18)) = 8;
  WriteGeometryFile(this,noMtl);
  if (!noMtl) {
    WriteMaterialFile(this);
  }
  std::locale::~locale((locale *)aaStack_48);
  return;
}

Assistant:

ObjExporter::ObjExporter(const char* _filename, const aiScene* pScene, bool noMtl)
: filename(_filename)
, pScene(pScene)
, vn()
, vt()
, vp()
, useVc(false)
, mVnMap()
, mVtMap()
, mVpMap()
, mMeshes()
, endl("\n") {
    // make sure that all formatting happens using the standard, C locale and not the user's current locale
    const std::locale& l = std::locale("C");
    mOutput.imbue(l);
    mOutput.precision(ASSIMP_AI_REAL_TEXT_PRECISION);
    mOutputMat.imbue(l);
    mOutputMat.precision(ASSIMP_AI_REAL_TEXT_PRECISION);

    WriteGeometryFile(noMtl);
    if ( !noMtl ) {
        WriteMaterialFile();
    }
}